

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_model_Test::Clone_model_Test(Clone_model_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001173d0;
  return;
}

Assistant:

TEST(Clone, model)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");
    m->setEncapsulationId("encapsulation_id");

    auto mClone = m->clone();

    compareModel(m, mClone);
}